

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
                *m)

{
  undefined8 uVar1;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
  *pMVar2;
  bool bVar3;
  int iVar4;
  lazy_ostream *plVar5;
  undefined4 local_128;
  Dimension local_124;
  basic_cstring<const_char> local_120;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_110;
  basic_cstring<const_char> local_e8;
  basic_cstring<const_char> local_d8;
  uint local_c8 [4];
  initializer_list<unsigned_int> local_b8;
  uint local_a8 [6];
  initializer_list<unsigned_int> local_90;
  undefined4 local_7c;
  Dimension local_78 [4];
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
  *local_10;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
  *m_local;
  
  local_10 = m;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x39f,&local_30);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar5,(char (*) [1])0x2b422c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_78[0] = Gudhi::persistence_matrix::
                  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
                  ::get_max_dimension(local_10);
    local_7c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_58,&local_68,0x39f,1,2,local_78,"m.get_max_dimension()",&local_7c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
    pMVar2 = local_10;
  } while (bVar3);
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_a8[2] = 2;
  local_a8[3] = 3;
  local_a8[4] = 4;
  local_a8[5] = 5;
  local_90._M_array = local_a8;
  local_90._M_len = 6;
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>
              *)pMVar2,&local_90,iVar4);
  pMVar2 = local_10;
  local_c8[0] = 0;
  local_c8[1] = 1;
  local_c8[2] = 2;
  local_c8[3] = 3;
  local_b8._M_array = local_c8;
  local_b8._M_len = 4;
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true,true>>
              *)pMVar2,&local_b8,iVar4);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d8,0x3a9,&local_e8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_110,plVar5,(char (*) [1])0x2b422c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_124 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true,_true>_>
                ::get_max_dimension(local_10);
    local_128 = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_110,&local_120,0x3a9,1,2,&local_124,"m.get_max_dimension()",&local_128,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_110);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}